

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  long lVar1;
  wchar_t wVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t __tmp;
  int *piVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  size_t size;
  byte bVar11;
  unsigned_long uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  buffer<wchar_t> *c;
  bool bVar17;
  int iVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  uVar16 = (ulong)(uint)specs->width;
  iVar23 = f->num_digits;
  uVar10 = (ulong)(iVar23 + 2U);
  puVar8 = *(undefined8 **)this;
  lVar9 = puVar8[2];
  if (iVar23 + 2U < (uint)specs->width) {
    uVar13 = lVar9 + uVar16;
    if ((ulong)puVar8[3] < uVar13) {
      (**(code **)*puVar8)(puVar8,uVar13);
    }
    puVar8[2] = uVar13;
    auVar6 = _DAT_013320d0;
    auVar5 = _DAT_012b0ff0;
    auVar4 = _DAT_012b0fe0;
    lVar3 = puVar8[1];
    puVar8 = (undefined8 *)(lVar3 + lVar9 * 4);
    wVar2 = (specs->fill).data_[0];
    uVar13 = uVar16 - uVar10;
    bVar11 = specs->field_0x9 & 0xf;
    if (bVar11 == 3) {
      uVar14 = uVar13 >> 1;
      if (1 < uVar13) {
        puVar8 = (undefined8 *)((long)puVar8 + uVar14 * 4);
        uVar13 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar28._8_4_ = (int)uVar13;
        auVar28._0_8_ = uVar13;
        auVar28._12_4_ = (int)(uVar13 >> 0x20);
        lVar3 = lVar3 + lVar9 * 4;
        lVar9 = 0;
        auVar28 = auVar28 ^ _DAT_012b0ff0;
        do {
          auVar25._8_4_ = (int)lVar9;
          auVar25._0_8_ = lVar9;
          auVar25._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar29 = (auVar25 | auVar4) ^ auVar5;
          iVar23 = auVar28._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar23 && auVar28._0_4_ < auVar29._0_4_ ||
                      iVar23 < auVar29._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar9 * 4) = wVar2;
          }
          if ((auVar29._12_4_ != auVar28._12_4_ || auVar29._8_4_ <= auVar28._8_4_) &&
              auVar29._12_4_ <= auVar28._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar9 * 4) = wVar2;
          }
          auVar25 = (auVar25 | auVar6) ^ auVar5;
          iVar30 = auVar25._4_4_;
          if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar25._0_4_ <= auVar28._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar9 * 4) = wVar2;
            *(wchar_t *)(lVar3 + 0xc + lVar9 * 4) = wVar2;
          }
          lVar9 = lVar9 + 4;
        } while ((uVar13 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
      *puVar8 = 0x7800000030;
      lVar9 = (long)f->num_digits;
      piVar7 = (int *)((long)puVar8 + lVar9 * 4 + 4);
      uVar12 = f->value;
      do {
        *piVar7 = (int)"0123456789abcdef"[(uint)uVar12 & 0xf];
        auVar6 = _DAT_013320d0;
        auVar5 = _DAT_012b0ff0;
        auVar4 = _DAT_012b0fe0;
        piVar7 = piVar7 + -1;
        bVar17 = 0xf < uVar12;
        uVar12 = uVar12 >> 4;
      } while (bVar17);
      uVar16 = (uVar16 * 4 + (uVar14 + uVar10) * -4) - 4;
      auVar29._8_4_ = (int)uVar16;
      auVar29._0_8_ = uVar16;
      auVar29._12_4_ = (int)(uVar16 >> 0x20);
      auVar20._0_8_ = uVar16 >> 2;
      auVar20._8_8_ = auVar29._8_8_ >> 2;
      uVar10 = 0;
      auVar20 = auVar20 ^ _DAT_012b0ff0;
      do {
        auVar26._8_4_ = (int)uVar10;
        auVar26._0_8_ = uVar10;
        auVar26._12_4_ = (int)(uVar10 >> 0x20);
        auVar28 = (auVar26 | auVar4) ^ auVar5;
        iVar23 = auVar20._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar23 && auVar20._0_4_ < auVar28._0_4_ ||
                    iVar23 < auVar28._4_4_) & 1)) {
          *(wchar_t *)((long)puVar8 + uVar10 * 4 + lVar9 * 4 + 8) = wVar2;
        }
        if ((auVar28._12_4_ != auVar20._12_4_ || auVar28._8_4_ <= auVar20._8_4_) &&
            auVar28._12_4_ <= auVar20._12_4_) {
          *(wchar_t *)((long)puVar8 + uVar10 * 4 + lVar9 * 4 + 0xc) = wVar2;
        }
        auVar28 = (auVar26 | auVar6) ^ auVar5;
        iVar30 = auVar28._4_4_;
        if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar28._0_4_ <= auVar20._0_4_)) {
          *(wchar_t *)((long)puVar8 + uVar10 * 4 + lVar9 * 4 + 0x10) = wVar2;
          *(wchar_t *)((long)puVar8 + uVar10 * 4 + lVar9 * 4 + 0x14) = wVar2;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar16 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
    }
    else if (bVar11 == 2) {
      uVar14 = (uVar16 * 4 + uVar10 * -4) - 4;
      auVar18._8_4_ = (int)uVar14;
      auVar18._0_8_ = uVar14;
      auVar18._12_4_ = (int)(uVar14 >> 0x20);
      auVar19._0_8_ = uVar14 >> 2;
      auVar19._8_8_ = auVar18._8_8_ >> 2;
      lVar1 = lVar3 + lVar9 * 4;
      uVar15 = 0;
      auVar19 = auVar19 ^ _DAT_012b0ff0;
      do {
        auVar24._8_4_ = (int)uVar15;
        auVar24._0_8_ = uVar15;
        auVar24._12_4_ = (int)(uVar15 >> 0x20);
        auVar28 = (auVar24 | auVar4) ^ auVar5;
        iVar23 = auVar19._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar23 && auVar19._0_4_ < auVar28._0_4_ ||
                    iVar23 < auVar28._4_4_) & 1)) {
          *(wchar_t *)(lVar1 + uVar15 * 4) = wVar2;
        }
        if ((auVar28._12_4_ != auVar19._12_4_ || auVar28._8_4_ <= auVar19._8_4_) &&
            auVar28._12_4_ <= auVar19._12_4_) {
          *(wchar_t *)(lVar1 + 4 + uVar15 * 4) = wVar2;
        }
        auVar28 = (auVar24 | auVar6) ^ auVar5;
        iVar30 = auVar28._4_4_;
        if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar28._0_4_ <= auVar19._0_4_)) {
          *(wchar_t *)(lVar1 + 8 + uVar15 * 4) = wVar2;
          *(wchar_t *)(lVar1 + 0xc + uVar15 * 4) = wVar2;
        }
        uVar15 = uVar15 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar15);
      *(undefined8 *)((long)puVar8 + uVar13 * 4) = 0x7800000030;
      piVar7 = (int *)((long)f->num_digits * 4 + lVar9 * 4 + uVar16 * 4 + uVar10 * -4 + lVar3 + 4);
      uVar12 = f->value;
      do {
        *piVar7 = (int)"0123456789abcdef"[(uint)uVar12 & 0xf];
        piVar7 = piVar7 + -1;
        bVar17 = 0xf < uVar12;
        uVar12 = uVar12 >> 4;
      } while (bVar17);
    }
    else {
      *(undefined8 *)(lVar3 + lVar9 * 4) = 0x7800000030;
      lVar9 = (long)f->num_digits * 4 + lVar9 * 4;
      piVar7 = (int *)(lVar3 + lVar9 + 4);
      uVar12 = f->value;
      do {
        *piVar7 = (int)"0123456789abcdef"[(uint)uVar12 & 0xf];
        auVar6 = _DAT_013320d0;
        auVar5 = _DAT_012b0ff0;
        auVar4 = _DAT_012b0fe0;
        piVar7 = piVar7 + -1;
        bVar17 = 0xf < uVar12;
        uVar12 = uVar12 >> 4;
      } while (bVar17);
      uVar16 = (uVar16 * 4 + uVar10 * -4) - 4;
      auVar21._8_4_ = (int)uVar16;
      auVar21._0_8_ = uVar16;
      auVar21._12_4_ = (int)(uVar16 >> 0x20);
      auVar22._0_8_ = uVar16 >> 2;
      auVar22._8_8_ = auVar21._8_8_ >> 2;
      lVar9 = lVar9 + lVar3;
      uVar10 = 0;
      auVar22 = auVar22 ^ _DAT_012b0ff0;
      do {
        auVar27._8_4_ = (int)uVar10;
        auVar27._0_8_ = uVar10;
        auVar27._12_4_ = (int)(uVar10 >> 0x20);
        auVar28 = (auVar27 | auVar4) ^ auVar5;
        iVar23 = auVar22._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar23 && auVar22._0_4_ < auVar28._0_4_ ||
                    iVar23 < auVar28._4_4_) & 1)) {
          *(wchar_t *)(lVar9 + 8 + uVar10 * 4) = wVar2;
        }
        if ((auVar28._12_4_ != auVar22._12_4_ || auVar28._8_4_ <= auVar22._8_4_) &&
            auVar28._12_4_ <= auVar22._12_4_) {
          *(wchar_t *)(lVar9 + 0xc + uVar10 * 4) = wVar2;
        }
        auVar28 = (auVar27 | auVar6) ^ auVar5;
        iVar30 = auVar28._4_4_;
        if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar28._0_4_ <= auVar22._0_4_)) {
          *(wchar_t *)(lVar9 + 0x10 + uVar10 * 4) = wVar2;
          *(wchar_t *)(lVar9 + 0x14 + uVar10 * 4) = wVar2;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar16 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
    }
  }
  else {
    uVar10 = lVar9 + uVar10;
    if ((ulong)puVar8[3] < uVar10) {
      (**(code **)*puVar8)(puVar8,uVar10);
      iVar23 = f->num_digits;
    }
    puVar8[2] = uVar10;
    lVar3 = puVar8[1];
    *(undefined8 *)(lVar3 + lVar9 * 4) = 0x7800000030;
    piVar7 = (int *)((long)iVar23 * 4 + lVar9 * 4 + lVar3 + 4);
    uVar12 = f->value;
    do {
      *piVar7 = (int)"0123456789abcdef"[(uint)uVar12 & 0xf];
      piVar7 = piVar7 + -1;
      bVar17 = 0xf < uVar12;
      uVar12 = uVar12 >> 4;
    } while (bVar17);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }